

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O1

int mcpl2ssw_app_usage(char **argv,char *errmsg)

{
  void *__ptr;
  
  if (errmsg == (char *)0x0) {
    __ptr = (void *)mcpl_usage_progname(*argv);
    puts("Usage:\n");
    printf("  %s [options] <input.mcpl> <reference.ssw> [output.ssw]\n\n",__ptr);
    puts(
        "Converts the Monte Carlo particles in the input MCPL file to SSW format\n(MCNP Surface Source Write) and stores the result in the designated output\nfile (defaults to \"output.ssw\").\n\nIn order to do so and get the details of the SSW format correct, the user\nmust also provide a reference SSW file from the same approximate setup\n(MCNP version, input deck...) where the new SSW file is to be used. The\nreference SSW file can of course be very small, as only the file header is\nimportant (the new file essentially gets a copy of the header found in the\nreference file, except for certain fields related to number of particles\nwhose values are changed).\n\nFinally, one must pay attention to the Surface ID assigned to the\nparticles in the resulting SSW file: Either the user specifies a global\none with -s<ID>, or it is assumed that the MCPL userflags field in the\ninput file is actually intended to become the Surface ID. Note that not\nall MCPL files have userflag fields and that valid Surface IDs are\nintegers in the range 1-999999.\n\nOptions:\n\n  -h, --help   : Show this usage information.\n  -s<ID>       : All particles in the SSW file will get this surface ID.\n  -l<LIMIT>    : Limit the number of particles transferred to the SSW file\n                 (defaults to 2147483647, the maximal SSW capacity)."
        );
    free(__ptr);
  }
  else {
    printf("ERROR: %s\n\n");
    puts("Run with -h or --help for usage information");
  }
  return (uint)(errmsg != (char *)0x0);
}

Assistant:

int mcpl2ssw_app_usage( const char** argv, const char * errmsg ) {
  if (errmsg) {
    printf("ERROR: %s\n\n",errmsg);
    printf("Run with -h or --help for usage information\n");
    return 1;
  }
  char * progname = mcpl_usage_progname(argv[0]);
  printf("Usage:\n\n");
  printf("  %s [options] <input.mcpl> <reference.ssw> [output.ssw]\n\n",progname);
  printf("Converts the Monte Carlo particles in the input MCPL file to SSW format\n"
         "(MCNP Surface Source Write) and stores the result in the designated output\n"
         "file (defaults to \"output.ssw\").\n"
         "\n"
         "In order to do so and get the details of the SSW format correct, the user\n"
         "must also provide a reference SSW file from the same approximate setup\n"
         "(MCNP version, input deck...) where the new SSW file is to be used. The\n"
         "reference SSW file can of course be very small, as only the file header is\n"
         "important (the new file essentially gets a copy of the header found in the\n"
         "reference file, except for certain fields related to number of particles\n"
         "whose values are changed).\n"
         "\n"
         "Finally, one must pay attention to the Surface ID assigned to the\n"
         "particles in the resulting SSW file: Either the user specifies a global\n"
         "one with -s<ID>, or it is assumed that the MCPL userflags field in the\n"
         "input file is actually intended to become the Surface ID. Note that not\n"
         "all MCPL files have userflag fields and that valid Surface IDs are\n"
         "integers in the range 1-999999.\n"
         "\n"
         "Options:\n"
         "\n"
         "  -h, --help   : Show this usage information.\n"
         "  -s<ID>       : All particles in the SSW file will get this surface ID.\n"
         "  -l<LIMIT>    : Limit the number of particles transferred to the SSW file\n"
         "                 (defaults to 2147483647, the maximal SSW capacity).\n"
         );
  free(progname);
  return 0;
}